

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

void __thiscall
ArenaVectorBase<ArenaVector<int>,_int>::reallocate
          (ArenaVectorBase<ArenaVector<int>,_int> *this,size_t size)

{
  int *piVar1;
  int *piVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  
  piVar1 = this->data;
  ArenaVector<int>::allocate((ArenaVector<int> *)this,size);
  piVar2 = this->data;
  uVar3 = this->usedElements;
  for (uVar4 = 0; uVar4 < uVar3; uVar4 = uVar4 + 1) {
    piVar2[uVar4] = piVar1[uVar4];
  }
  return;
}

Assistant:

void reallocate(size_t size) {
    T* old = data;
    static_cast<SubType*>(this)->allocate(size);
    for (size_t i = 0; i < usedElements; i++) {
      data[i] = old[i];
    }
  }